

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur_device.cpp
# Opt level: O2

void device_render(int *pixels,uint width,uint height,float time,ISPCCamera *camera)

{
  Vector *pVVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  size_t size;
  float fVar14;
  
  _DAT_002acd90 = g_spp;
  DAT_002acd94 = g_motion_blur;
  _DAT_002acd98 = g_time;
  _DAT_002acd9c = g_shutter_close;
  if (g_animate) {
    fVar14 = cosf(time);
    _DAT_002acd98 = fVar14 * 0.5 + 0.5;
    _DAT_002acd9c = powf(_DAT_002acd98,4.0);
    g_reset = true;
  }
  if ((DAT_002acda8 != width) || (DAT_002acdac != height)) {
    embree::alignedUSMFree(DAT_002acda0);
    size = (ulong)(height * width) << 4;
    DAT_002acda0 = embree::alignedUSMMalloc(size,0x10,DEFAULT);
    DAT_002acda8 = width;
    DAT_002acdac = height;
    for (sVar13 = 0; size != sVar13; sVar13 = sVar13 + 0x10) {
      puVar2 = (undefined8 *)((long)DAT_002acda0 + sVar13);
      *puVar2 = 0;
      puVar2[1] = 0;
    }
  }
  if ((g_changed != false) || (uVar8 = (uint)g_reset, g_reset != false)) {
    embree::updateTransformation();
    rtcCommitScene(embree::data);
    _DAT_002acd80 = rtcGetSceneTraversable(embree::data);
    uVar8 = 1;
    if ((g_changed & 1U) == 0) {
      uVar8 = (uint)g_reset;
    }
  }
  g_changed = false;
  g_reset = false;
  auVar4._4_4_ = -(uint)(DAT_002acdc0_4 != (camera->xfm).l.vx.field_0.field_0.y);
  auVar4._0_4_ = -(uint)(_DAT_002acdc0 != (camera->xfm).l.vx.field_0.field_0.x);
  auVar4._8_4_ = -(uint)(fRam00000000002acdc8 != (camera->xfm).l.vx.field_0.field_0.z);
  auVar4._12_4_ = -(uint)(fRam00000000002acdcc != 0.0);
  uVar12 = movmskps(0x2acd50,auVar4);
  uVar12 = (uVar12 & 7) != 0 | uVar8;
  fRam00000000002acdcc = 0.0;
  _DAT_002acdc0 = (undefined1  [12])(camera->xfm).l.vx.field_0;
  pVVar1 = &(camera->xfm).l.vy;
  auVar5._4_4_ = -(uint)(DAT_002acdd0_4 != (camera->xfm).l.vy.field_0.field_0.y);
  auVar5._0_4_ = -(uint)(_DAT_002acdd0 != (pVVar1->field_0).field_0.x);
  auVar5._8_4_ = -(uint)(fRam00000000002acdd8 != (camera->xfm).l.vy.field_0.field_0.z);
  auVar5._12_4_ = -(uint)(fRam00000000002acddc != 0.0);
  uVar10 = movmskps(uVar8,auVar5);
  fRam00000000002acddc = 0.0;
  _DAT_002acdd0 = (undefined1  [12])pVVar1->field_0;
  pVVar1 = &(camera->xfm).l.vz;
  auVar6._4_4_ = -(uint)(DAT_002acde0_4 != (camera->xfm).l.vz.field_0.field_0.y);
  auVar6._0_4_ = -(uint)(_DAT_002acde0 != (pVVar1->field_0).field_0.x);
  auVar6._8_4_ = -(uint)(fRam00000000002acde8 != (camera->xfm).l.vz.field_0.field_0.z);
  auVar6._12_4_ = -(uint)(fRam00000000002acdec != 0.0);
  uVar11 = movmskps(uVar10,auVar6);
  fRam00000000002acdec = 0.0;
  _DAT_002acde0 = (undefined1  [12])pVVar1->field_0;
  uVar3 = *(undefined8 *)((long)&(camera->xfm).p.field_0 + 4);
  fVar14 = (float)((ulong)uVar3 >> 0x20);
  pVVar1 = &(camera->xfm).p;
  auVar7._4_4_ = -(uint)(DAT_002acdf0_4 != (float)uVar3);
  auVar7._0_4_ = -(uint)(_DAT_002acdf0 != (pVVar1->field_0).field_0.x);
  auVar7._8_4_ = -(uint)(fRam00000000002acdf8 != fVar14);
  auVar7._12_4_ = -(uint)(fRam00000000002acdfc != 0.0);
  uVar8 = movmskps(uVar12,auVar7);
  fRam00000000002acdf8 = fVar14;
  _DAT_002acdf0 = *(undefined8 *)&pVVar1->field_0;
  fRam00000000002acdfc = 0.0;
  if ((uVar8 & 7) == 0 && (((uVar11 & 7) == 0 && (uVar10 & 7) == 0) && uVar12 == 0)) {
    _DAT_002acdb0 = _DAT_002acdb0 + 1;
  }
  else {
    _DAT_002acdb0 = 0;
    for (lVar9 = 0; (ulong)(height * width) << 4 != lVar9; lVar9 = lVar9 + 0x10) {
      puVar2 = (undefined8 *)((long)DAT_002acda0 + lVar9);
      *puVar2 = 0;
      puVar2[1] = 0;
    }
  }
  return;
}

Assistant:

void device_render (int* pixels,
                           const unsigned int width,
                           const unsigned int height,
                           const float time,
                           const ISPCCamera& camera)
{
  data.g_spp = g_spp;
  data.g_motion_blur = g_motion_blur;
  data.g_time = g_time;
  data.g_shutter_close = g_shutter_close;

  if (g_animate) {
    data.g_time = 0.5f * cos(time) + 0.5f;
    data.g_shutter_close = pow(data.g_time, 4.f);
    g_reset = true;
  }

  if (data.g_accu_width != width || data.g_accu_height != height) {
    alignedUSMFree(data.g_accu);
    data.g_accu = (Vec3ff*) alignedUSMMalloc((width*height)*sizeof(Vec3ff),16,EmbreeUSMMode::DEVICE_READ_WRITE);
    data.g_accu_width = width;
    data.g_accu_height = height;
    for (unsigned int i=0; i<width*height; i++)
      data.g_accu[i] = Vec3ff(0.0f);
  }

  if (g_changed || g_reset)
  {
    updateTransformation();
    rtcCommitScene(data.g_scene);
    data.g_traversable = rtcGetSceneTraversable(data.g_scene);
  }


  /* reset accumulator */
  bool camera_changed = g_changed || g_reset; g_changed = false; g_reset = false;
  camera_changed |= ne(data.g_accu_vx,camera.xfm.l.vx); data.g_accu_vx = camera.xfm.l.vx;
  camera_changed |= ne(data.g_accu_vy,camera.xfm.l.vy); data.g_accu_vy = camera.xfm.l.vy;
  camera_changed |= ne(data.g_accu_vz,camera.xfm.l.vz); data.g_accu_vz = camera.xfm.l.vz;
  camera_changed |= ne(data.g_accu_p, camera.xfm.p);    data.g_accu_p  = camera.xfm.p;
  if (camera_changed) {
    data.g_accu_count=0;
    for (unsigned int i=0; i<width*height; i++)
      data.g_accu[i] = Vec3ff(0.0f);
  }
  else {
    data.g_accu_count++;
  }
}